

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

uint16_t __thiscall helics::CoreBroker::getNextAirlockIndex(CoreBroker *this)

{
  atomic<unsigned_short> *paVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  
  LOCK();
  paVar1 = &this->nextAirLock;
  uVar2 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
  (paVar1->super___atomic_base<unsigned_short>)._M_i =
       (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
  UNLOCK();
  uVar5 = uVar2 & 1;
  if (uVar2 < 3) {
    uVar5 = uVar2;
  }
  if (uVar5 == 2) {
    uVar4 = 3;
    do {
      uVar3 = (ushort)uVar4;
      LOCK();
      uVar2 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
      if (uVar3 == uVar2) {
        (this->nextAirLock).super___atomic_base<unsigned_short>._M_i =
             uVar3 + (short)(uVar4 / 3) * -3;
      }
      else {
        uVar4 = (uint)uVar2;
      }
      UNLOCK();
    } while ((uVar3 != uVar2) && (2 < (ushort)uVar4));
  }
  return uVar5;
}

Assistant:

uint16_t CoreBroker::getNextAirlockIndex()
{
    uint16_t index = nextAirLock++;
    if (index > 2) {  // this is an atomic operation if the nextAirLock was not adjusted this could
                      // result in an out of bounds
        // exception if this check were not done
        index %= 2;
    }
    if (index == 2) {
        decltype(index) exp = 3;

        while (exp > 2) {  // doing a lock free modulus we need to make sure the nextAirLock<4
            if (nextAirLock.compare_exchange_weak(exp, exp % 3)) {
                break;
            }
        }
    }
    return index;
}